

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISingleStringReader.h
# Opt level: O1

void __thiscall
ISingleStringReader::ISingleStringReader
          (ISingleStringReader *this,ifstream *ifs,ostream *os,int deep,string *str,string *dataType
          )

{
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110c00;
  (this->m_str)._M_dataplus._M_p = (pointer)&(this->m_str).field_2;
  (this->m_str)._M_string_length = 0;
  (this->m_str).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_IAbstractReader).m_dataType);
  std::__cxx11::string::_M_assign((string *)&this->m_str);
  return;
}

Assistant:

explicit ISingleStringReader (std::ifstream* ifs, std::ostream* os, int deep,std::string str,std::string dataType="Keyword"): IAbstractReader(ifs, os, deep) {
        m_dataType = dataType;
        m_str = str;
    }